

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

QSize __thiscall QMdiArea::minimumSizeHint(QMdiArea *this)

{
  bool bVar1;
  undefined4 uVar2;
  QMdiAreaPrivate *this_00;
  QStyle *pQVar3;
  const_iterator o;
  QMdiSubWindow *pQVar4;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QMdiSubWindow *child;
  QList<QPointer<QMdiSubWindow>_> *__range2;
  QMdiAreaPrivate *d;
  const_iterator __end2;
  const_iterator __begin2;
  QSize size;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  QSize *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  QAbstractScrollArea *in_stack_ffffffffffffffa0;
  const_iterator local_28;
  QSize local_20;
  QSize local_18;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QMdiArea *)0x613290);
  local_10 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  pQVar3 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  uVar2 = (**(code **)(*(long *)pQVar3 + 0xe0))(pQVar3,0x2d,0,in_RDI);
  pQVar3 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  (**(code **)(*(long *)pQVar3 + 0xe0))(pQVar3,0x1a,0,in_RDI);
  QSize::QSize(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
  local_20 = QAbstractScrollArea::minimumSizeHint(in_stack_ffffffffffffffa0);
  local_18 = QSize::expandedTo((QSize *)CONCAT44(uVar2,in_stack_ffffffffffffff88),
                               in_stack_ffffffffffffff80);
  local_10 = local_18;
  bVar1 = QMdiAreaPrivate::scrollBarsEnabled(this_00);
  if (!bVar1) {
    local_28.i = (QPointer<QMdiSubWindow> *)&DAT_aaaaaaaaaaaaaaaa;
    local_28 = QList<QPointer<QMdiSubWindow>_>::begin
                         ((QList<QPointer<QMdiSubWindow>_> *)in_stack_ffffffffffffff80);
    o = QList<QPointer<QMdiSubWindow>_>::end
                  ((QList<QPointer<QMdiSubWindow>_> *)in_stack_ffffffffffffff80);
    while (bVar1 = QList<QPointer<QMdiSubWindow>_>::const_iterator::operator!=(&local_28,o), bVar1)
    {
      QList<QPointer<QMdiSubWindow>_>::const_iterator::operator*(&local_28);
      pQVar4 = ::QPointer::operator_cast_to_QMdiSubWindow_((QPointer<QMdiSubWindow> *)0x6133be);
      bVar1 = sanityCheck((QMdiSubWindow *)in_stack_ffffffffffffff80,
                          (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      if (bVar1) {
        (**(code **)(*(long *)&pQVar4->super_QWidget + 0x78))();
        local_10 = QSize::expandedTo((QSize *)CONCAT44(uVar2,in_stack_ffffffffffffff88),
                                     in_stack_ffffffffffffff80);
      }
      QList<QPointer<QMdiSubWindow>_>::const_iterator::operator++(&local_28);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

QSize QMdiArea::minimumSizeHint() const
{
    Q_D(const QMdiArea);
    QSize size(style()->pixelMetric(QStyle::PM_MdiSubWindowMinimizedWidth, nullptr, this),
               style()->pixelMetric(QStyle::PM_TitleBarHeight, nullptr, this));
    size = size.expandedTo(QAbstractScrollArea::minimumSizeHint());
    if (!d->scrollBarsEnabled()) {
        for (QMdiSubWindow *child : d->childWindows) {
            if (!sanityCheck(child, "QMdiArea::sizeHint"))
                continue;
            size = size.expandedTo(child->minimumSizeHint());
        }
    }
    return size;
}